

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_reduce.hpp
# Opt level: O2

BBox<2> * __thiscall
Omega_h::
transform_reduce<Omega_h::IntIterator,Omega_h::GetBBoxOp<2>,Omega_h::BBox<2>,Omega_h::UniteOp<2>>
          (BBox<2> *__return_storage_ptr__,int param_2,int first,Write<signed_char> *param_4,
          undefined8 param_5,undefined8 param_6,double init,double param_8,double param_9,
          double param_10)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  void *pvVar5;
  long lVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double adStack_b8 [2];
  Vector<2> v;
  double local_98 [4];
  double local_78;
  double dStack_70;
  BBox<2> c;
  type transform_local;
  
  entering_parallel = 1;
  adStack_b8[1] = 1.15610224775866e-317;
  Write<double>::Write((Write<signed_char> *)&transform_local,param_4);
  entering_parallel = 0;
  lVar4 = (long)param_2;
  pvVar5 = (void *)(lVar4 * 0x10 + (long)transform_local.coords.write_.shared_alloc_.direct_ptr);
  for (; lVar4 != first; lVar4 = lVar4 + 1) {
    for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
      v.super_Few<double,_2>.array_[lVar6] = *(double *)((long)pvVar5 + lVar6 * 8);
    }
    local_78 = param_9;
    dStack_70 = param_10;
    local_98[2] = init;
    local_98[3] = param_8;
    local_98[0] = v.super_Few<double,_2>.array_[0];
    local_98[1] = v.super_Few<double,_2>.array_[1];
    for (lVar6 = 2; lVar6 != 4; lVar6 = lVar6 + 1) {
      dVar1 = adStack_b8[lVar6];
      uVar7 = SUB84(dVar1,0);
      uVar8 = (undefined4)((ulong)dVar1 >> 0x20);
      dVar2 = v.super_Few<double,_2>.array_[lVar6];
      uVar9 = SUB84(dVar2,0);
      uVar10 = (undefined4)((ulong)dVar2 >> 0x20);
      dVar3 = local_98[lVar6];
      if (dVar3 <= dVar1) {
        uVar7 = SUB84(dVar3,0);
        uVar8 = (undefined4)((ulong)dVar3 >> 0x20);
      }
      local_98[lVar6 + 5] = (double)CONCAT44(uVar8,uVar7);
      dVar1 = local_98[lVar6 + 2];
      if (dVar2 <= dVar1) {
        uVar9 = SUB84(dVar1,0);
        uVar10 = (undefined4)((ulong)dVar1 >> 0x20);
      }
      c.min.super_Few<double,_2>.array_[lVar6] = (double)CONCAT44(uVar10,uVar9);
    }
    init = c.min.super_Few<double,_2>.array_[0];
    param_8 = c.min.super_Few<double,_2>.array_[1];
    param_9 = c.max.super_Few<double,_2>.array_[0];
    param_10 = c.max.super_Few<double,_2>.array_[1];
    pvVar5 = (void *)((long)pvVar5 + 0x10);
  }
  (__return_storage_ptr__->max).super_Few<double,_2>.array_[0] = param_9;
  (__return_storage_ptr__->max).super_Few<double,_2>.array_[1] = param_10;
  (__return_storage_ptr__->min).super_Few<double,_2>.array_[0] = init;
  (__return_storage_ptr__->min).super_Few<double,_2>.array_[1] = param_8;
  adStack_b8[1] = 1.15620353121606e-317;
  Write<double>::~Write((Write<double> *)&transform_local);
  return __return_storage_ptr__;
}

Assistant:

Result transform_reduce(
    Iterator first, Iterator last, Result init, Op op, Tranform&& transform) {
  Omega_h::entering_parallel = true;
  auto const transform_local = std::move(transform);
  Omega_h::entering_parallel = false;
  for (; first != last; ++first) {
    init = op(std::move(init), transform_local(*first));
  }
  return init;
}